

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::add_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,InterfaceBlockMeta *meta)

{
  TypeID id;
  ID id_00;
  BuiltIn BVar1;
  CompilerMSL *this_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ExecutionModel EVar6;
  uint32_t uVar7;
  SPIRType *pSVar8;
  SPIRType *struct_type;
  SPIRConstant *pSVar9;
  undefined7 extraout_var;
  CompilerError *this_01;
  uint *ts_1;
  uint32_t mbr_idx;
  uint index;
  SPIRVariable *pSVar10;
  ulong uVar11;
  undefined4 uVar12;
  undefined8 unaff_R15;
  BuiltIn builtin;
  InterfaceBlockMeta *local_280;
  undefined4 local_274;
  uint local_270;
  uint32_t var_mbr_idx;
  SPIRType *local_268;
  undefined4 local_25c;
  uint local_258;
  uint32_t location;
  string *local_250;
  SPIRType *local_248;
  uint32_t initializer;
  CompilerMSL *local_238;
  undefined8 local_230;
  SPIRVariable *local_228;
  ulong local_220;
  undefined4 local_214;
  uint32_t var_id;
  uint32_t ptr_type_id;
  SmallVector<unsigned_int,_8UL> *local_1d0;
  ParsedIR *local_1c8;
  SPIRFunction *local_1c0;
  string var_name;
  uint32_t locn;
  undefined4 uStack_194;
  undefined1 auStack_190 [24];
  uint *local_178;
  size_t sStack_170;
  size_t local_168;
  __node_base_ptr ap_Stack_160 [8];
  uint32_t local_120;
  bool local_11c;
  StorageClass local_108;
  TypeID local_74;
  
  pSVar10 = var;
  local_250 = ib_var_ref;
  local_248 = ib_type;
  local_1c0 = Compiler::get<spirv_cross::SPIRFunction>
                        ((Compiler *)this,
                         (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  local_280 = meta;
  if (meta->strip_array == true) {
    pSVar8 = Compiler::get_variable_element_type((Compiler *)this,var);
  }
  else {
    pSVar8 = Compiler::get_variable_data_type((Compiler *)this,var);
  }
  bVar2 = Compiler::is_builtin_variable((Compiler *)this,var);
  builtin = Compiler::get_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
  bVar3 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(pSVar8->super_IVariant).self.id,DecorationBlock);
  local_268 = pSVar8;
  if (storage == StorageClassOutput) {
    bVar4 = CompilerGLSL::is_stage_output_variable_masked(&this->super_CompilerGLSL,var);
    if (bVar4) {
      emit_local_masked_variable(this,var,local_280->strip_array);
      return;
    }
LAB_001da4bb:
    local_274 = 0;
  }
  else {
    if (storage != StorageClassInput) goto LAB_001da4bb;
    if ((pSVar8->basetype == Struct) &&
       ((((bVar4 = is_tesc_shader(this), bVar4 &&
          ((this->msl_options).multi_patch_workgroup != false)) ||
         ((bVar4 = is_tese_shader(this), bVar4 &&
          ((this->msl_options).raw_buffer_tese_input == true)))) &&
        (bVar4 = Compiler::has_decoration
                           ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation),
        bVar4)))) {
      uVar7 = Compiler::get_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
      locn = uVar7;
      struct_type = Compiler::get_variable_data_type((Compiler *)this,var);
      pSVar8 = local_268;
      ensure_struct_members_valid_vecsizes(this,struct_type,&locn);
    }
    bVar4 = Compiler::has_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationPerVertexKHR);
    local_274 = (undefined4)CONCAT71((int7)((ulong)ib_type >> 8),1);
    if (bVar4) {
      this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_01,"PerVertexKHR decoration is not supported in MSL.");
      goto LAB_001dad7b;
    }
  }
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(var->super_IVariant).self.id);
  if (pSVar8->basetype == Struct) {
    bVar4 = variable_storage_requires_stage_io(this,storage);
    if ((!bVar4) && (bVar3)) {
      bVar4 = (pSVar8->array).super_VectorView<unsigned_int>.buffer_size == 0;
    }
    uVar12 = (undefined4)CONCAT71((int7)((ulong)unaff_R15 >> 8),1);
    if ((!bVar2 && bVar4 == true) && (local_280->allow_local_declaration == true)) {
      emit_local_masked_variable(this,var,local_280->strip_array);
      uVar12 = 0;
    }
    if (bVar4 == false) {
LAB_001da66a:
      add_plain_variable_to_interface_block(this,storage,local_250,local_248,var,local_280);
      return;
    }
    location = 0xffffffff;
    var_mbr_idx = 0;
    bVar2 = Compiler::is_matrix((Compiler *)this,pSVar8);
    bVar4 = Compiler::is_array((Compiler *)this,pSVar8);
    local_214 = uVar12;
    if (bVar2) {
      if (bVar4) {
        this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_01,"MSL cannot emit arrays-of-matrices in input and output variables.");
LAB_001dad7b:
        __cxa_throw(this_01,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_270 = pSVar8->columns;
    }
    else if (bVar4) {
      if ((pSVar8->array).super_VectorView<unsigned_int>.buffer_size != 1) {
        this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_01,"MSL cannot emit arrays-of-arrays in input and output variables.");
        goto LAB_001dad7b;
      }
      local_270 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSVar8);
    }
    else {
      local_270 = 1;
    }
    local_1c8 = &(this->super_CompilerGLSL).super_Compiler.ir;
    local_1d0 = &this->vars_needing_early_declaration;
    local_220 = 0;
    local_230._0_4_ = 0;
    local_230._4_4_ = StorageClassUniformConstant;
    local_238 = this;
    local_228 = var;
    for (local_258 = 0; local_258 < local_270; local_258 = local_258 + 1) {
      for (uVar11 = 0; pSVar8 = local_268,
          uVar11 < (uint)(local_268->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
          uVar11 = uVar11 + 1) {
        builtin = BuiltInMax;
        uVar7 = (uint32_t)uVar11;
        bVar2 = Compiler::is_member_builtin((Compiler *)this,local_268,uVar7,&builtin);
        pSVar8 = Compiler::get<spirv_cross::SPIRType>
                           ((Compiler *)this,
                            (pSVar8->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                            [uVar11].id);
        if ((storage == StorageClassOutput) &&
           (bVar4 = CompilerGLSL::is_stage_output_block_member_masked
                              (&this->super_CompilerGLSL,var,uVar7,local_280->strip_array), bVar4))
        {
          location = 0xffffffff;
          local_230._0_1_ = (byte)local_230 | bVar3;
          if ((bVar2) && (local_280->strip_array == false)) {
            ptr_type_id = ParsedIR::increase_bound_by(local_1c8,2);
            var_id = ptr_type_id + 1;
            SPIRType::SPIRType((SPIRType *)&locn,pSVar8);
            local_11c = true;
            local_120 = local_120 + 1;
            local_74.id = (local_268->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar11]
                          .id;
            initializer = 0;
            local_108 = StorageClassOutput;
            uVar7 = (var->initializer).id;
            if ((uVar7 != 0) &&
               (pSVar9 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,uVar7),
               pSVar9 != (SPIRConstant *)0x0)) {
              initializer = (pSVar9->subconstants).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr
                            [uVar11].id;
            }
            Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                      ((Compiler *)this,ptr_type_id,(SPIRType *)&locn);
            var_name._M_dataplus._M_p._0_4_ = 3;
            pSVar10 = (SPIRVariable *)&initializer;
            Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,unsigned_int&>
                      ((Compiler *)this,var_id,&ptr_type_id,(StorageClass *)&var_name,
                       (uint *)pSVar10);
            SPIRFunction::add_local_variable(local_1c0,(VariableID)var_id);
            SmallVector<unsigned_int,_8UL>::push_back(local_1d0,&var_id);
            uVar7 = var_id;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                      (&var_name,this,(ulong)builtin,3);
            Compiler::set_name((Compiler *)this,(ID)uVar7,&var_name);
            ::std::__cxx11::string::~string((string *)&var_name);
            Compiler::set_decoration((Compiler *)this,(ID)var_id,DecorationBuiltIn,builtin);
            SPIRType::~SPIRType((SPIRType *)&locn);
          }
        }
        else if ((!bVar2) ||
                (bVar4 = Compiler::has_active_builtin((Compiler *)this,builtin,storage), bVar4)) {
          bVar4 = Compiler::is_matrix((Compiler *)this,pSVar8);
          if ((bVar4) || (bVar4 = Compiler::is_array((Compiler *)this,pSVar8), bVar4)) {
            local_25c = 0;
          }
          else {
            local_25c = (undefined4)CONCAT71(extraout_var,pSVar8->basetype != Struct);
          }
          bVar4 = true;
          if ((byte)local_274 != '\0') {
            EVar6 = Compiler::get_execution_model((Compiler *)this);
            bVar4 = EVar6 == ExecutionModelFragment;
          }
          bVar5 = variable_storage_requires_stage_io(this,storage);
          BVar1 = builtin;
          ts_1 = (uint *)0x1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&var_name,this,(ulong)(local_228->super_IVariant).self.id);
          ::std::__cxx11::string::string((string *)&ptr_type_id,(string *)&var_name);
          ::std::__cxx11::string::string((string *)&var_id,(string *)&var_name);
          if (1 < local_270) {
            join<char_const(&)[2],unsigned_int&>
                      ((string *)&locn,(spirv_cross *)0x282e15,(char (*) [2])&local_258,ts_1);
            ::std::__cxx11::string::append((string *)&ptr_type_id);
            ::std::__cxx11::string::~string((string *)&locn);
            join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                      ((string *)&locn,(spirv_cross *)0x2828da,(char (*) [2])&local_258,
                       (uint *)0x2827df,(char (*) [2])pSVar10);
            ::std::__cxx11::string::append((string *)&var_id);
            ::std::__cxx11::string::~string((string *)&locn);
          }
          var = local_228;
          this = local_238;
          pSVar10 = local_228;
          if (((~bVar5 | (byte)local_25c) & 1) == 0 &&
              (bVar2 & bVar4 & BVar1 - BuiltInVertexId < 0xfffffffe) == 0) {
            _locn = (pointer)0x0;
            auStack_190._0_8_ = ap_Stack_160;
            auStack_190._8_8_ = 1;
            auStack_190._16_4_ = 0;
            auStack_190._20_4_ = 0;
            local_178 = (uint *)0x0;
            sStack_170 = 0x3f800000;
            local_168 = 0;
            ap_Stack_160[0] = (__node_base_ptr)0x0;
            add_composite_member_variable_to_interface_block
                      (local_238,storage,local_250,local_248,local_228,local_268,uVar7,local_280,
                       (string *)&ptr_type_id,(string *)&var_id,&location,&var_mbr_idx,
                       (Bitset *)&locn);
            ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)auStack_190);
            local_220 = (ulong)var_mbr_idx;
          }
          else {
            add_plain_member_variable_to_interface_block
                      (local_238,storage,local_250,local_248,local_228,local_268,uVar7,local_280,
                       (string *)&ptr_type_id,(string *)&var_id,&location,&var_mbr_idx);
          }
          ::std::__cxx11::string::~string((string *)&var_id);
          ::std::__cxx11::string::~string((string *)&ptr_type_id);
          ::std::__cxx11::string::~string((string *)&var_name);
        }
        var_mbr_idx = (int)local_220 + 1;
        local_220 = (ulong)var_mbr_idx;
      }
    }
    if ((((byte)local_214 & (byte)local_230) != 0) &&
       ((bVar2 = Compiler::is_builtin_variable((Compiler *)this,var), !bVar2 ||
        (bVar2 = is_tesc_shader(this), bVar2)))) {
      bVar2 = Compiler::is_builtin_variable((Compiler *)this,var);
      this_00 = local_238;
      if (bVar2) {
        for (index = 0; id.id = (local_268->super_IVariant).self.id,
            index < (uint)(local_268->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
            ; index = index + 1) {
          uVar7 = Compiler::get_member_decoration((Compiler *)this_00,id,index,DecorationBuiltIn);
          (*(this_00->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                    ((string *)&locn,this_00,(ulong)uVar7,3);
          Compiler::set_member_name((Compiler *)this_00,id,index,(string *)&locn);
          ::std::__cxx11::string::~string((string *)&locn);
        }
        ::std::__cxx11::string::string((string *)&locn,"gl_PerVertex",(allocator *)&var_name);
        this = local_238;
        Compiler::set_name((Compiler *)local_238,(ID)id.id,(string *)&locn);
        pSVar8 = local_268;
        ::std::__cxx11::string::~string((string *)&locn);
        id_00.id = (var->super_IVariant).self.id;
        ::std::__cxx11::string::string((string *)&locn,"gl_out_masked",(allocator *)&var_name);
        Compiler::set_name((Compiler *)this,id_00,(string *)&locn);
        ::std::__cxx11::string::~string((string *)&locn);
        (this->stage_out_masked_builtin_type_id).id = (pSVar8->super_IVariant).self.id;
      }
      emit_local_masked_variable(this,var,local_280->strip_array);
    }
  }
  else {
    bVar3 = is_tese_shader(this);
    if (((((bVar3 & (byte)local_274) == 1) && (bVar2)) && (local_280->strip_array == false)) &&
       (builtin - BuiltInTessLevelOuter < 2)) {
      add_tess_level_input_to_interface_block(this,local_250,local_248,var);
      return;
    }
    if (((pSVar8->basetype < MeshGridProperties) &&
        ((0x8077fcU >> (pSVar8->basetype & (MeshGridProperties|Int)) & 1) != 0)) &&
       ((!bVar2 || (bVar3 = Compiler::has_active_builtin((Compiler *)this,builtin,storage), bVar3)))
       ) {
      bVar3 = Compiler::is_matrix((Compiler *)this,pSVar8);
      if (bVar3) {
        bVar3 = false;
      }
      else {
        bVar3 = Compiler::is_array((Compiler *)this,pSVar8);
        bVar3 = !bVar3;
      }
      bVar4 = variable_storage_requires_stage_io(this,storage);
      bVar5 = true;
      if ((byte)local_274 != '\0') {
        EVar6 = Compiler::get_execution_model((Compiler *)this);
        bVar5 = EVar6 == ExecutionModelFragment;
      }
      if ((!bVar3 && bVar4) && (bVar2 & bVar5 & builtin - BuiltInVertexId < 0xfffffffe) == 0) {
        add_composite_variable_to_interface_block(this,storage,local_250,local_248,var,local_280);
        return;
      }
      goto LAB_001da66a;
    }
  }
  return;
}

Assistant:

void CompilerMSL::add_variable_to_interface_block(StorageClass storage, const string &ib_var_ref, SPIRType &ib_type,
                                                  SPIRVariable &var, InterfaceBlockMeta &meta)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	// Tessellation control I/O variables and tessellation evaluation per-point inputs are
	// usually declared as arrays. In these cases, we want to add the element type to the
	// interface block, since in Metal it's the interface block itself which is arrayed.
	auto &var_type = meta.strip_array ? get_variable_element_type(var) : get_variable_data_type(var);
	bool is_builtin = is_builtin_variable(var);
	auto builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
	bool is_block = has_decoration(var_type.self, DecorationBlock);

	// If stage variables are masked out, emit them as plain variables instead.
	// For builtins, we query them one by one later.
	// IO blocks are not masked here, we need to mask them per-member instead.
	if (storage == StorageClassOutput && is_stage_output_variable_masked(var))
	{
		// If we ignore an output, we must still emit it, since it might be used by app.
		// Instead, just emit it as early declaration.
		emit_local_masked_variable(var, meta.strip_array);
		return;
	}

	// Tesselation stages pass I/O via buffer content which may contain nested structs.
	// Ensure the vector sizes of any nested struct members within these input variables match
	// the vector sizes of the corresponding output variables from the previous pipeline stage.
	// This adjustment is handled here instead of ensure_correct_input_type() in order to
	// perform the necessary recursive processing.
	if (storage == StorageClassInput && var_type.basetype == SPIRType::Struct &&
		((is_tesc_shader() && msl_options.multi_patch_workgroup) ||
		 (is_tese_shader() && msl_options.raw_buffer_tese_input)) &&
		has_decoration(var.self, DecorationLocation))
	{
		uint32_t locn = get_decoration(var.self, DecorationLocation);
		ensure_struct_members_valid_vecsizes(get_variable_data_type(var), locn);
	}

	if (storage == StorageClassInput && has_decoration(var.self, DecorationPerVertexKHR))
		SPIRV_CROSS_THROW("PerVertexKHR decoration is not supported in MSL.");

	// If variable names alias, they will end up with wrong names in the interface struct, because
	// there might be aliases in the member name cache and there would be a mismatch in fixup_in code.
	// Make sure to register the variables as unique resource names ahead of time.
	// This would normally conflict with the name cache when emitting local variables,
	// but this happens in the setup stage, before we hit compilation loops.
	// The name cache is cleared before we actually emit code, so this is safe.
	add_resource_name(var.self);

	if (var_type.basetype == SPIRType::Struct)
	{
		bool block_requires_flattening =
		    variable_storage_requires_stage_io(storage) || (is_block && var_type.array.empty());
		bool needs_local_declaration = !is_builtin && block_requires_flattening && meta.allow_local_declaration;

		if (needs_local_declaration)
		{
			// For I/O blocks or structs, we will need to pass the block itself around
			// to functions if they are used globally in leaf functions.
			// Rather than passing down member by member,
			// we unflatten I/O blocks while running the shader,
			// and pass the actual struct type down to leaf functions.
			// We then unflatten inputs, and flatten outputs in the "fixup" stages.
			emit_local_masked_variable(var, meta.strip_array);
		}

		if (!block_requires_flattening)
		{
			// In Metal tessellation shaders, the interface block itself is arrayed. This makes things
			// very complicated, since stage-in structures in MSL don't support nested structures.
			// Luckily, for stage-out when capturing output, we can avoid this and just add
			// composite members directly, because the stage-out structure is stored to a buffer,
			// not returned.
			add_plain_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
		}
		else
		{
			bool masked_block = false;
			uint32_t location = UINT32_MAX;
			uint32_t var_mbr_idx = 0;
			uint32_t elem_cnt = 1;
			if (is_matrix(var_type))
			{
				if (is_array(var_type))
					SPIRV_CROSS_THROW("MSL cannot emit arrays-of-matrices in input and output variables.");

				elem_cnt = var_type.columns;
			}
			else if (is_array(var_type))
			{
				if (var_type.array.size() != 1)
					SPIRV_CROSS_THROW("MSL cannot emit arrays-of-arrays in input and output variables.");

				elem_cnt = to_array_size_literal(var_type);
			}

			for (uint32_t elem_idx = 0; elem_idx < elem_cnt; elem_idx++)
			{
				// Flatten the struct members into the interface struct
				for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(var_type.member_types.size()); mbr_idx++)
				{
					builtin = BuiltInMax;
					is_builtin = is_member_builtin(var_type, mbr_idx, &builtin);
					auto &mbr_type = get<SPIRType>(var_type.member_types[mbr_idx]);

					if (storage == StorageClassOutput && is_stage_output_block_member_masked(var, mbr_idx, meta.strip_array))
					{
						location = UINT32_MAX; // Skip this member and resolve location again on next var member

						if (is_block)
							masked_block = true;

						// Non-builtin block output variables are just ignored, since they will still access
						// the block variable as-is. They're just not flattened.
						if (is_builtin && !meta.strip_array)
						{
							// Emit a fake variable instead.
							uint32_t ids = ir.increase_bound_by(2);
							uint32_t ptr_type_id = ids + 0;
							uint32_t var_id = ids + 1;

							auto ptr_type = mbr_type;
							ptr_type.pointer = true;
							ptr_type.pointer_depth++;
							ptr_type.parent_type = var_type.member_types[mbr_idx];
							ptr_type.storage = StorageClassOutput;

							uint32_t initializer = 0;
							if (var.initializer)
								if (auto *c = maybe_get<SPIRConstant>(var.initializer))
									initializer = c->subconstants[mbr_idx];

							set<SPIRType>(ptr_type_id, ptr_type);
							set<SPIRVariable>(var_id, ptr_type_id, StorageClassOutput, initializer);
							entry_func.add_local_variable(var_id);
							vars_needing_early_declaration.push_back(var_id);
							set_name(var_id, builtin_to_glsl(builtin, StorageClassOutput));
							set_decoration(var_id, DecorationBuiltIn, builtin);
						}
					}
					else if (!is_builtin || has_active_builtin(builtin, storage))
					{
						bool is_composite_type = is_matrix(mbr_type) || is_array(mbr_type) || mbr_type.basetype == SPIRType::Struct;
						bool attribute_load_store =
								storage == StorageClassInput && get_execution_model() != ExecutionModelFragment;
						bool storage_is_stage_io = variable_storage_requires_stage_io(storage);

						// Clip/CullDistance always need to be declared as user attributes.
						if (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance)
							is_builtin = false;

						const string var_name = to_name(var.self);
						string mbr_name_qual = var_name;
						string var_chain_qual = var_name;
						if (elem_cnt > 1)
						{
							mbr_name_qual += join("_", elem_idx);
							var_chain_qual += join("[", elem_idx, "]");
						}

						if ((!is_builtin || attribute_load_store) && storage_is_stage_io && is_composite_type)
						{
							add_composite_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
							                                                 var, var_type, mbr_idx, meta,
							                                                 mbr_name_qual, var_chain_qual,
							                                                 location, var_mbr_idx, {});
						}
						else
						{
							add_plain_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
							                                             var, var_type, mbr_idx, meta,
							                                             mbr_name_qual, var_chain_qual,
							                                             location, var_mbr_idx);
						}
					}
					var_mbr_idx++;
				}
			}

			// If we're redirecting a block, we might still need to access the original block
			// variable if we're masking some members.
			if (masked_block && !needs_local_declaration && (!is_builtin_variable(var) || is_tesc_shader()))
			{
				if (is_builtin_variable(var))
				{
					// Ensure correct names for the block members if we're actually going to
					// declare gl_PerVertex.
					for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(var_type.member_types.size()); mbr_idx++)
					{
						set_member_name(var_type.self, mbr_idx, builtin_to_glsl(
								BuiltIn(get_member_decoration(var_type.self, mbr_idx, DecorationBuiltIn)),
								StorageClassOutput));
					}

					set_name(var_type.self, "gl_PerVertex");
					set_name(var.self, "gl_out_masked");
					stage_out_masked_builtin_type_id = var_type.self;
				}
				emit_local_masked_variable(var, meta.strip_array);
			}
		}
	}
	else if (is_tese_shader() && storage == StorageClassInput && !meta.strip_array && is_builtin &&
	         (builtin == BuiltInTessLevelOuter || builtin == BuiltInTessLevelInner))
	{
		add_tess_level_input_to_interface_block(ib_var_ref, ib_type, var);
	}
	else if (var_type.basetype == SPIRType::Boolean || var_type.basetype == SPIRType::Char ||
	         type_is_integral(var_type) || type_is_floating_point(var_type))
	{
		if (!is_builtin || has_active_builtin(builtin, storage))
		{
			bool is_composite_type = is_matrix(var_type) || is_array(var_type);
			bool storage_is_stage_io = variable_storage_requires_stage_io(storage);
			bool attribute_load_store = storage == StorageClassInput && get_execution_model() != ExecutionModelFragment;

			// Clip/CullDistance always needs to be declared as user attributes.
			if (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance)
				is_builtin = false;

			// MSL does not allow matrices or arrays in input or output variables, so need to handle it specially.
			if ((!is_builtin || attribute_load_store) && storage_is_stage_io && is_composite_type)
			{
				add_composite_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
			}
			else
			{
				add_plain_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
			}
		}
	}
}